

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O1

void ossdsp_str(osgen_win_t *win,int y,int x,int color,char *str,size_t len,int *delta_yscroll)

{
  int iVar1;
  char cVar2;
  int left_column;
  int iVar3;
  int iVar4;
  ulong uVar5;
  
  if (delta_yscroll != (int *)0x0) {
    *delta_yscroll = 0;
  }
  if (len != 0) {
    do {
      uVar5 = ((long)win->winx - (long)x) + win->wid;
      if (len <= uVar5) {
        uVar5 = len;
      }
      cVar2 = str[uVar5];
      str[uVar5] = '\0';
      ossdsp(y,x,color,str);
      str[uVar5] = cVar2;
      x = (int)uVar5 + x;
      left_column = win->winx;
      iVar3 = (int)win->wid + left_column;
      iVar1 = y;
      if ((iVar3 <= x) && (iVar1 = y + 1, x = left_column, delta_yscroll != (int *)0x0)) {
        iVar4 = (int)win->ht + win->winy;
        if (iVar4 <= iVar1) {
          ossscr(win->winy,left_column,iVar4 + -1,iVar3 + -1,win->oss_fillcolor);
          win->scrolly = win->scrolly + 1;
          *delta_yscroll = *delta_yscroll + 1;
          iVar1 = y;
        }
      }
      y = iVar1;
      str = str + uVar5;
      len = len - uVar5;
    } while (len != 0);
  }
  return;
}

Assistant:

static void ossdsp_str(osgen_win_t *win, int y, int x, int color,
                       char *str, size_t len, int *delta_yscroll)
{
    /* presume we won't scroll */
    if (delta_yscroll != 0)
        *delta_yscroll = 0;

    /* keep going until we exhaust the string */
    while (len != 0)
    {
        size_t cur;
        unsigned char oldc;

        /* display as much as will fit on the current line before wrapping */
        cur = win->winx + win->wid - x;
        if (cur > len)
            cur = len;

        /* null-terminate the chunk, but save the original character */
        oldc = str[cur];
        str[cur] = '\0';

        /* display this chunk */
        ossdsp(y, x, color, (char *)str);

        /* restore the character where we put our null */
        str[cur] = oldc;

        /* move our string counters past this chunk */
        str += cur;
        len -= cur;

        /* advance the x position */
        x += cur;

        /* if we've reached the right edge of the window, wrap the line */
        if (x >= win->winx + (int)win->wid)
        {
            /* wrap to the left edge of the window */
            x = win->winx;

            /* advance to the next line */
            ++y;

            /* 
             *   if this puts us past the bottom of the window, and we're
             *   allowed to scroll the window, do so
             */
            if (y >= win->winy + (int)win->ht && delta_yscroll != 0)
            {
                /* scroll by one line */
                ossscr(win->winy, win->winx,
                       win->winy + win->ht - 1, win->winx + win->wid - 1,
                       win->oss_fillcolor);

                /* adjust the scroll position of the window */
                win->scrolly++;

                /* count the scrolling */
                ++(*delta_yscroll);

                /* move back a line */
                --y;
            }
        }
    }
}